

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O1

ssize_t __thiscall
Server::Private::ClientImpl::write(ClientImpl *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  ulong extraout_RAX;
  void *pvVar3;
  ulong extraout_RAX_00;
  ulong uVar4;
  undefined4 in_register_00000034;
  HashSet<Server::Private::ClientImpl_*> *this_00;
  int in_R8D;
  ClientImpl *local_30;
  
  if ((this->_sendBuffer).bufferStart == (this->_sendBuffer).bufferEnd) {
    pvVar3 = (void *)Socket::send(&this->super_Socket,__fd,__buf,__n,in_R8D);
    if (pvVar3 == (void *)0x0) {
LAB_0010eb98:
      if (__n != 0) {
        *(undefined8 *)__n = 0;
      }
      this_00 = &this->_p->_closingClients;
      local_30 = this;
      HashSet<Server::Private::ClientImpl_*>::insert(this_00,&this_00->_end,&local_30);
      uVar4 = 0;
LAB_0010ec03:
      bVar1 = false;
    }
    else {
      if (pvVar3 == (void *)0xffffffffffffffff) {
        iVar2 = Socket::getLastError();
        if (iVar2 != 0) goto LAB_0010eb98;
        pvVar3 = (void *)0x0;
      }
      if (__buf < pvVar3 || (long)__buf - (long)pvVar3 == 0) {
        uVar4 = CONCAT71((int7)((ulong)pvVar3 >> 8),1);
        if (__n != 0) {
          *(undefined8 *)__n = 0;
        }
        goto LAB_0010ec03;
      }
      Buffer::append(&this->_sendBuffer,(byte *)CONCAT44(in_register_00000034,__fd) + (long)pvVar3,
                     (long)__buf - (long)pvVar3);
      Socket::Poll::set(&this->_p->_sockets,&this->super_Socket,this->_suspended ^ 3);
      bVar1 = true;
      uVar4 = extraout_RAX_00;
    }
    if (!bVar1) goto LAB_0010ec1b;
  }
  else {
    Buffer::append(&this->_sendBuffer,(byte *)CONCAT44(in_register_00000034,__fd),(usize)__buf);
    uVar4 = extraout_RAX;
  }
  uVar4 = CONCAT71((int7)(uVar4 >> 8),1);
  if (__n != 0) {
    *(long *)__n = (long)(this->_sendBuffer).bufferEnd - (long)(this->_sendBuffer).bufferStart;
  }
LAB_0010ec1b:
  return uVar4 & 0xffffffffffffff01;
}

Assistant:

bool Server::Private::ClientImpl::write(const byte *data, usize size, usize *postponed)
{
  if (_sendBuffer.isEmpty())
  {
    ssize sent = send(data, size);
    switch (sent)
    {
    case -1:
      if (Socket::getLastError() == 0) // EWOULDBLOCK
      {
        sent = 0;
        break;
      }
      // no break
    case 0:
      if (postponed)
        *postponed = 0;
      _p._closingClients.append(this);
      return false;
    default:
      break;
    }
    if ((usize)sent >= size)
    {
      if (postponed)
        *postponed = 0;
      return true;
    }
    _sendBuffer.append(data + sent, size - sent);
    _p._sockets.set(*this, _suspended ? Socket::Poll::writeFlag : (Socket::Poll::readFlag | Socket::Poll::writeFlag));
  }
  else
    _sendBuffer.append(data, size);
  if (postponed)
    *postponed = _sendBuffer.size();
  return true;
}